

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FeatureType FVar6;
  WebPMuxError WVar7;
  undefined4 uVar8;
  WebPMuxError WVar9;
  uint uVar10;
  WebPMux *pWVar11;
  void *ptr;
  long lVar12;
  WebPMux *pWVar13;
  uint nth;
  long lVar14;
  char *__format;
  WebPData *params;
  char *pcVar15;
  char *pcVar16;
  FeatureArg *pFVar17;
  ulong uVar18;
  WebPMux *pWVar19;
  char **ppcVar20;
  bool bVar21;
  ulong uStack_140;
  uint32_t flag;
  FeatureType local_134;
  WebPMux *local_130;
  WebPMux *mux;
  int local_11c;
  int dispose_method;
  uint local_114;
  char **local_110;
  WebPData chunk;
  undefined8 local_f8;
  uint local_f0;
  WebPChunkId local_ec;
  WebPMuxAnimDispose local_e8;
  WebPMuxAnimBlend local_e4;
  char plus_minus;
  undefined3 uStack_cb;
  Config config;
  char *local_70;
  int nFrames;
  int unused;
  int parse_error;
  uint uStack_5c;
  int local_58;
  int local_50;
  FeatureArg *local_38;
  
  config.type_ = NIL_FEATURE;
  config._68_4_ = 0;
  config.args_ = (FeatureArg *)0x0;
  config.input_ = (char *)0x0;
  config.output_ = (char *)0x0;
  config.cmd_args_.own_argv_ = 0;
  config.cmd_args_._36_4_ = 0;
  config.action_type_ = NIL_ACTION;
  config._44_4_ = 0;
  config.cmd_args_.argv_data_.bytes = (uint8_t *)0x0;
  config.cmd_args_.argv_data_.size = 0;
  config.cmd_args_.argc_ = 0;
  config.cmd_args_._4_4_ = 0;
  config.cmd_args_.argv_ = (char **)0x0;
  config.arg_count_ = 0;
  config._84_4_ = 0;
  iVar2 = ExUtilInitCommandLineArguments(argc + -1,argv + 1,&config.cmd_args_);
  if (iVar2 != 0) {
    iVar2 = CountOccurrences(&config.cmd_args_,"-get");
    if (1 < iVar2) {
      pcVar16 = "ERROR: Multiple \'-get\' arguments specified.\n";
LAB_00102a2b:
      uStack_140 = 0x2c;
      goto LAB_0010318c;
    }
    iVar2 = CountOccurrences(&config.cmd_args_,"-set");
    if (1 < iVar2) {
      pcVar16 = "ERROR: Multiple \'-set\' arguments specified.\n";
      goto LAB_00102a2b;
    }
    iVar2 = CountOccurrences(&config.cmd_args_,"-strip");
    if (1 < iVar2) {
      pcVar16 = "ERROR: Multiple \'-strip\' arguments specified.\n";
      uStack_140 = 0x2e;
      goto LAB_0010318c;
    }
    iVar2 = CountOccurrences(&config.cmd_args_,"-info");
    if (1 < iVar2) {
      pcVar16 = "ERROR: Multiple \'-info\' arguments specified.\n";
LAB_00102a9e:
      uStack_140 = 0x2d;
      goto LAB_0010318c;
    }
    iVar2 = CountOccurrences(&config.cmd_args_,"-o");
    if (1 < iVar2) {
      pcVar16 = "ERROR: Multiple output files specified.\n";
      uStack_140 = 0x28;
      goto LAB_0010318c;
    }
    iVar2 = CountOccurrences(&config.cmd_args_,"-frame");
    iVar3 = CountOccurrences(&config.cmd_args_,"-loop");
    iVar4 = CountOccurrences(&config.cmd_args_,"-bgcolor");
    iVar5 = CountOccurrences(&config.cmd_args_,"-duration");
    if (1 < iVar3) {
      pcVar16 = "ERROR: Multiple loop counts specified.\n";
      uStack_140 = 0x27;
      goto LAB_0010318c;
    }
    if (1 < iVar4) {
      pcVar16 = "ERROR: Multiple background colors specified.\n";
      goto LAB_00102a9e;
    }
    if (0 < iVar4 + iVar3 && iVar2 == 0) {
      pcVar16 = "ERROR: Loop count and background color are relevant only in case of animation.\n";
      uStack_140 = 0x4f;
      goto LAB_0010318c;
    }
    if (iVar2 != 0 && 0 < iVar5) {
      pcVar16 = "ERROR: Can not combine -duration and -frame commands.\n";
      uStack_140 = 0x36;
      goto LAB_0010318c;
    }
    config.arg_count_ = iVar4 + iVar3 + iVar2;
    if (iVar2 == 0) {
      config.arg_count_ = 1;
    }
    if (0 < iVar5) {
      config.arg_count_ = iVar5;
    }
    config.args_ = (FeatureArg *)calloc((long)config.arg_count_,0x18);
    local_38 = config.args_;
    if (config.args_ != (FeatureArg *)0x0) {
      local_130 = (WebPMux *)CONCAT44(local_130._4_4_,config.cmd_args_.argc_);
      uStack_140 = config._40_8_ & 0xffffffff;
      local_70 = config.input_;
      local_11c = 0;
      local_134 = config.type_;
      local_110 = config.cmd_args_.argv_;
      ppcVar20 = config.cmd_args_.argv_;
      iVar2 = 0;
LAB_00102533:
      if ((int)(uint)local_130 <= iVar2) goto LAB_00102b38;
      pFVar17 = local_38 + local_11c;
      pcVar16 = ppcVar20[iVar2];
      iVar3 = (int)uStack_140;
      if (*pcVar16 == '-') {
        iVar4 = strcmp(pcVar16,"-set");
        if (iVar4 == 0) {
          if (iVar3 != 0) goto LAB_00102aed;
          config.action_type_ = ACTION_SET;
          uStack_140 = 2;
          iVar2 = iVar2 + 1;
          goto LAB_00102533;
        }
        iVar4 = strcmp(pcVar16,"-duration");
        if (iVar4 == 0) {
          if ((int)(uint)local_130 < iVar2 + 2) goto LAB_00102b1d;
          if ((iVar3 == 6) || (iVar3 == 0)) {
            config.action_type_ = ACTION_DURATION;
            if ((local_134 != NIL_FEATURE) && (local_134 != FEATURE_DURATION)) goto LAB_00103179;
            config.type_ = FEATURE_DURATION;
            pFVar17->params_ = ppcVar20[(long)iVar2 + 1];
            local_11c = local_11c + 1;
            uStack_140 = 6;
            iVar2 = iVar2 + 2;
            local_134 = FEATURE_DURATION;
            goto LAB_00102533;
          }
LAB_00102aed:
          pcVar16 = "ERROR: Multiple actions specified.\n";
          uStack_140 = 0x23;
          goto LAB_0010318c;
        }
        iVar4 = strcmp(pcVar16,"-get");
        if (iVar4 == 0) {
          if (iVar3 == 0) {
            config.action_type_ = ACTION_GET;
            uStack_140 = 1;
            iVar2 = iVar2 + 1;
            goto LAB_00102533;
          }
          goto LAB_00102aed;
        }
        iVar4 = strcmp(pcVar16,"-strip");
        if (iVar4 == 0) {
          if (iVar3 == 0) {
            config.action_type_ = ACTION_STRIP;
            config.arg_count_ = 0;
            uStack_140 = 3;
            iVar2 = iVar2 + 1;
            goto LAB_00102533;
          }
          goto LAB_00102aed;
        }
        iVar4 = strcmp(pcVar16,"-frame");
        if (iVar4 != 0) {
          iVar4 = strcmp(pcVar16,"-loop");
          if ((iVar4 == 0) || (iVar4 = strcmp(pcVar16,"-bgcolor"), iVar4 == 0)) {
            iVar3 = iVar2 + 2;
            if (iVar3 <= (int)(uint)local_130) {
              if ((uStack_140 & 0xfffffffd) == 0) {
                config.action_type_ = ACTION_SET;
                if ((local_134 & ~FEATURE_ANMF) == NIL_FEATURE) {
                  config.type_ = FEATURE_ANMF;
                  iVar4 = strcmp(pcVar16,"-loop");
                  pFVar17->subtype_ = SUBTYPE_BGCOLOR - (iVar4 == 0);
                  pcVar16 = local_110[(long)iVar2 + 1];
                  ppcVar20 = local_110;
                  goto LAB_001029a5;
                }
                goto LAB_00103179;
              }
              goto LAB_00102aed;
            }
            goto LAB_00102b1d;
          }
          cVar1 = pcVar16[1];
          if ((cVar1 == 'o') && (pcVar16[2] == '\0')) {
            if ((int)(uint)local_130 < iVar2 + 2) goto LAB_00102b1d;
            config.output_ = local_110[(long)iVar2 + 1];
            ppcVar20 = local_110;
            iVar2 = iVar2 + 2;
            goto LAB_00102533;
          }
          iVar4 = strcmp(pcVar16,"-info");
          if (iVar4 != 0) {
            if (((cVar1 == 'h') && (pcVar16[2] == '\0')) ||
               (iVar3 = strcmp(pcVar16,"-help"), iVar3 == 0)) {
              PrintHelp();
LAB_00103cef:
              DeleteConfig(&config);
              exit(0);
            }
            iVar3 = strcmp(pcVar16,"-version");
            if (iVar3 == 0) {
              uVar10 = WebPGetMuxVersion();
              printf("%d.%d.%d\n",(ulong)(uVar10 >> 0x10 & 0xff),(ulong)(uVar10 >> 8 & 0xff),
                     (ulong)(uVar10 & 0xff));
              goto LAB_00103cef;
            }
            if ((cVar1 == '-') && (pcVar16[2] == '\0')) {
              if (iVar2 < (int)((uint)local_130 + -1)) {
                if (local_70 != (char *)0x0) {
                  pcVar16 = local_110[iVar2 + 1];
                  pcVar15 = "ERROR at \'%s\': Multiple input files specified.\n";
                  goto LAB_00103a99;
                }
                config.input_ = local_110[iVar2 + 1];
              }
              goto LAB_00102b38;
            }
            pcVar15 = "ERROR: Unknown option: \'%s\'.\n";
            goto LAB_00103a99;
          }
          iVar4 = iVar2 + 2;
          if ((int)(uint)local_130 < iVar4) goto LAB_00102b1d;
          if ((int)(uint)local_130 <= iVar4) {
            if (iVar3 != 0) goto LAB_00102aed;
            config.action_type_ = ACTION_INFO;
            config.arg_count_ = 0;
            lVar14 = (long)iVar2;
            uStack_140 = 4;
            ppcVar20 = local_110;
            iVar2 = iVar4;
            config.input_ = local_110[lVar14 + 1];
            local_70 = local_110[lVar14 + 1];
            goto LAB_00102533;
          }
          pcVar15 = "ERROR: Too many arguments for \'%s\'.\n";
          goto LAB_00102b2e;
        }
        iVar3 = iVar2 + 3;
        if (iVar3 <= (int)(uint)local_130) {
          if ((uStack_140 & 0xfffffffd) == 0) {
            config.action_type_ = ACTION_SET;
            if ((local_134 & ~FEATURE_ANMF) == NIL_FEATURE) {
              config.type_ = FEATURE_ANMF;
              pFVar17->subtype_ = SUBTYPE_ANMF;
              pFVar17->filename_ = ppcVar20[(long)iVar2 + 1];
              pcVar16 = ppcVar20[(long)iVar2 + 2];
LAB_001029a5:
              pFVar17->params_ = pcVar16;
              local_11c = local_11c + 1;
              local_134 = FEATURE_ANMF;
              goto LAB_001029af;
            }
            goto LAB_00103179;
          }
          goto LAB_00102aed;
        }
      }
      else {
        if (iVar3 == 0) {
          pcVar16 = "ERROR: Action must be specified before other arguments.\n";
          uStack_140 = 0x38;
          goto LAB_0010318c;
        }
        iVar4 = strcmp(pcVar16,"icc");
        if (iVar4 == 0) {
          FVar6 = FEATURE_ICCP;
          if (local_134 != NIL_FEATURE) {
LAB_00103179:
            pcVar16 = "ERROR: Multiple features specified.\n";
            uStack_140 = 0x24;
            goto LAB_0010318c;
          }
LAB_00102769:
          ppcVar20 = local_110;
          local_134 = FVar6;
          config.type_ = FVar6;
          if (iVar3 == 2) {
            if ((int)(uint)local_130 < iVar2 + 2) goto LAB_00102b1d;
            pFVar17->filename_ = local_110[(long)iVar2 + 1];
            local_11c = local_11c + 1;
            uStack_140 = 2;
            iVar2 = iVar2 + 2;
          }
          else {
            iVar2 = iVar2 + 1;
          }
          goto LAB_00102533;
        }
        iVar4 = strcmp(pcVar16,"exif");
        if ((iVar4 == 0) || (iVar5 = strcmp(pcVar16,"xmp"), iVar5 == 0)) {
          if (local_134 != NIL_FEATURE) goto LAB_00103179;
          FVar6 = FEATURE_XMP - (iVar4 == 0);
          goto LAB_00102769;
        }
        iVar4 = strcmp(pcVar16,"frame");
        if ((iVar3 == 1) && (iVar4 == 0)) {
          if ((int)(uint)local_130 < iVar2 + 2) goto LAB_00102b1d;
          config.type_ = FEATURE_ANMF;
          pFVar17->params_ = local_110[(long)iVar2 + 1];
          local_11c = local_11c + 1;
          local_134 = FEATURE_ANMF;
          uStack_140 = 1;
          ppcVar20 = local_110;
          iVar2 = iVar2 + 2;
          goto LAB_00102533;
        }
        iVar4 = strcmp(pcVar16,"loop");
        ppcVar20 = local_110;
        if ((iVar3 == 2) && (iVar4 == 0)) {
          iVar3 = iVar2 + 2;
          if (iVar3 <= (int)(uint)local_130) {
            config.type_ = FEATURE_LOOP;
            pFVar17->params_ = local_110[(long)iVar2 + 1];
            local_11c = local_11c + 1;
            local_134 = FEATURE_LOOP;
LAB_001029af:
            uStack_140 = 2;
            iVar2 = iVar3;
            goto LAB_00102533;
          }
        }
        else {
          iVar4 = strcmp(pcVar16,"bgcolor");
          if ((iVar3 != 2) || (iVar4 != 0)) {
            if (local_70 == (char *)0x0) {
              iVar2 = iVar2 + 1;
              config.input_ = pcVar16;
              local_70 = pcVar16;
              goto LAB_00102533;
            }
            pcVar15 = "ERROR at \'%s\': Multiple input files specified.\n";
LAB_00103a99:
            fprintf(_stderr,pcVar15,pcVar16);
            goto LAB_00103195;
          }
          iVar3 = iVar2 + 2;
          if (iVar3 <= (int)(uint)local_130) {
            config.type_ = FEATURE_BGCOLOR;
            pFVar17->params_ = ppcVar20[(long)iVar2 + 1];
            local_11c = local_11c + 1;
            local_134 = FEATURE_BGCOLOR;
            goto LAB_001029af;
          }
        }
      }
LAB_00102b1d:
      pcVar15 = "ERROR: Too few arguments for \'%s\'.\n";
LAB_00102b2e:
      fprintf(_stderr,pcVar15,pcVar16);
      goto LAB_00102b38;
    }
    pcVar16 = "ERROR: Memory allocation error.\n";
    uStack_140 = 0x20;
    goto LAB_001031a8;
  }
LAB_001031b1:
  PrintHelp();
  uVar10 = 1;
  goto LAB_00103bb3;
LAB_00102b38:
  if (config.action_type_ == NIL_ACTION) {
    pcVar16 = "ERROR: No action specified.\n";
    uStack_140 = 0x1c;
LAB_0010318c:
    fwrite(pcVar16,uStack_140,1,_stderr);
LAB_00103195:
    pcVar16 = "Exiting due to command-line parsing error.\n";
    uStack_140 = 0x2b;
LAB_001031a8:
    fwrite(pcVar16,uStack_140,1,_stderr);
    goto LAB_001031b1;
  }
  if (config.action_type_ != ACTION_INFO && config.type_ == NIL_FEATURE) {
    pcVar16 = "ERROR: No feature specified.\n";
    uStack_140 = 0x1d;
    goto LAB_0010318c;
  }
  if ((config.input_ == (char *)0x0) &&
     ((config.action_type_ != ACTION_SET || (config.type_ != FEATURE_ANMF)))) {
    pcVar16 = "ERROR: No input file specified.\n";
    uStack_140 = 0x20;
    goto LAB_0010318c;
  }
  if ((config.action_type_ != ACTION_INFO) && (config.output_ == (char *)0x0)) {
    pcVar16 = "ERROR: No output file specified.\n";
    uStack_140 = 0x21;
    goto LAB_0010318c;
  }
  mux = (WebPMux *)0x0;
  uVar10 = 1;
  switch(config.action_type_) {
  case ACTION_GET:
    iVar2 = CreateMux(config.input_,&mux);
    pWVar13 = mux;
    uVar10 = 0;
    if (iVar2 != 0) {
      if (config.type_ - FEATURE_EXIF < 3) {
        WVar7 = WebPMuxGetChunk(mux,kFourccList[config.type_],&chunk);
        if (WVar7 != WEBP_MUX_OK) {
          pcVar16 = kErrorMessages[-WVar7];
          pcVar15 = kDescriptions[config.type_];
          __format = "ERROR (%s): Could not get the %s.\n";
          goto LAB_001038fc;
        }
        uVar10 = WriteData(config.output_,&chunk);
      }
      else {
        if (config.type_ != FEATURE_ANMF) {
          pcVar16 = "ERROR: Invalid feature for action \'get\'.\n";
          uStack_140 = 0x29;
          goto LAB_00103a54;
        }
        _parse_error = (WebPMuxAnimParams)((ulong)_parse_error & 0xffffffff00000000);
        chunk.bytes = (uint8_t *)0x0;
        chunk.size = 0;
        uVar10 = ExUtilGetInt((config.args_)->params_,10,&parse_error);
        if ((int)uVar10 < 0) {
          fwrite("ERROR: Frame/Fragment index must be non-negative.\n",0x32,1,_stderr);
LAB_00103bf2:
          pWVar11 = (WebPMux *)0x0;
          bVar21 = false;
        }
        else {
          pWVar11 = (WebPMux *)0x0;
          if (parse_error == 0) {
            WVar9 = WebPMuxGetFrame(pWVar13,uVar10,(WebPMuxFrameInfo *)&chunk);
            WVar7 = WEBP_MUX_NOT_FOUND;
            if (local_ec == WEBP_CHUNK_ANMF) {
              WVar7 = WVar9;
            }
            if (WVar9 != WEBP_MUX_OK) {
              WVar7 = WVar9;
            }
            if (WVar7 == WEBP_MUX_OK) {
              pWVar11 = WebPMuxNew();
              if (pWVar11 != (WebPMux *)0x0) {
                WVar7 = WebPMuxSetImage(pWVar11,&chunk,1);
                if (WVar7 == WEBP_MUX_OK) {
                  iVar2 = WriteWebP(pWVar11,config.output_);
                  bVar21 = iVar2 != 0;
                }
                else {
                  bVar21 = false;
                  fprintf(_stderr,"ERROR (%s): Could not create single image mux object.\n",
                          kErrorMessages[-WVar7]);
                }
                goto LAB_00103bf5;
              }
              fprintf(_stderr,"ERROR (%s): Could not allocate a mux object.\n",
                      "WEBP_MUX_MEMORY_ERROR");
            }
            else {
              fprintf(_stderr,"ERROR (%s): Could not get frame %d.\n",kErrorMessages[-WVar7],
                      (ulong)uVar10);
            }
            goto LAB_00103bf2;
          }
          bVar21 = true;
        }
LAB_00103bf5:
        WebPDataClear(&chunk);
        WebPMuxDelete(pWVar11);
        uVar10 = (uint)(byte)(parse_error == 0 & bVar21);
      }
    }
    break;
  case ACTION_SET:
    switch(config.type_) {
    case FEATURE_EXIF:
    case FEATURE_XMP:
    case FEATURE_ICCP:
      iVar2 = CreateMux(config.input_,&mux);
      uVar10 = 0;
      if ((iVar2 != 0) &&
         (iVar2 = ExUtilReadFileToWebPData((config.args_)->filename_,&chunk), pWVar13 = mux,
         iVar2 != 0)) {
        WVar7 = WebPMuxSetChunk(mux,kFourccList[config.type_],&chunk,1);
        WebPDataClear(&chunk);
        if (WVar7 != WEBP_MUX_OK) {
          pcVar16 = kErrorMessages[-WVar7];
          pcVar15 = kDescriptions[config.type_];
          __format = "ERROR (%s): Could not set the %s.\n";
          goto LAB_001038fc;
        }
LAB_001037d9:
        uVar10 = WriteWebP(pWVar13,config.output_);
      }
      goto switchD_00102bb9_caseD_5;
    case FEATURE_ANMF:
      parse_error = 0xffffffff;
      uStack_5c = 0;
      pWVar13 = WebPMuxNew();
      mux = pWVar13;
      if (pWVar13 == (WebPMux *)0x0) {
        pcVar15 = "ERROR (%s): Could not allocate a mux object.\n";
        pcVar16 = "WEBP_MUX_MEMORY_ERROR";
      }
      else {
        lVar14 = 0x10;
        for (uVar18 = 0; (long)uVar18 < (long)config.arg_count_; uVar18 = uVar18 + 1) {
          iVar2 = *(int *)((long)config.args_ + lVar14 + -0x10);
          if (iVar2 == 1) {
            local_ec = WEBP_CHUNK_ANMF;
            iVar2 = ExUtilReadFileToWebPData(*(char **)((long)config.args_ + lVar14 + -8),&chunk);
            if (iVar2 == 0) goto LAB_00103b9d;
            uVar8 = __isoc99_sscanf(*(undefined8 *)((long)&(config.args_)->subtype_ + lVar14),
                                    "+%d+%d+%d+%d%c%c+%d",&local_f0,&local_f8,(long)&local_f8 + 4,
                                    &dispose_method,&plus_minus,&flag,&unused);
            switch(uVar8) {
            case 1:
              local_f8 = 0;
              break;
            default:
              goto switchD_001034ea_caseD_2;
            case 3:
              break;
            case 4:
              goto switchD_001034ea_caseD_4;
            case 6:
              goto switchD_001034ea_caseD_6;
            }
            dispose_method = 0;
switchD_001034ea_caseD_4:
            _plus_minus = CONCAT31(uStack_cb,0x2b);
            flag = CONCAT31(flag._1_3_,0x62);
switchD_001034ea_caseD_6:
            if (((local_f8._4_4_ | (uint)local_f8) & 1) != 0) {
              fprintf(_stderr,
                      "Warning: odd offsets will be snapped to even values (%d, %d) -> (%d, %d)\n",
                      local_f8 & 0xffffffff,(ulong)local_f8._4_4_,
                      (ulong)((uint)local_f8 & 0xfffffffe),(ulong)(local_f8._4_4_ & 0xfffffffe));
            }
            local_e8 = dispose_method;
            if ((char)flag == 'b') {
              if (((_plus_minus & 0xff) == 0x2b) || ((_plus_minus & 0xff) == 0x2d)) {
                local_e4 = (WebPMuxAnimBlend)(plus_minus != '+');
                WVar7 = WebPMuxPushFrame(pWVar13,(WebPMuxFrameInfo *)&chunk,1);
                WebPDataClear(&chunk);
                if (WVar7 == WEBP_MUX_OK) goto LAB_00103599;
                fprintf(_stderr,"ERROR (%s): Could not add a frame at index %d.\n",
                        kErrorMessages[-WVar7],uVar18 & 0xffffffff);
                goto LAB_00103b9d;
              }
            }
switchD_001034ea_caseD_2:
            WebPDataClear(&chunk);
            pcVar16 = "ERROR: Could not parse frame properties.\n";
            goto LAB_00103b92;
          }
          if (iVar2 == 2) {
            chunk.bytes = (uint8_t *)((ulong)chunk.bytes & 0xffffffff00000000);
            uVar10 = ExUtilGetInt(*(char **)((long)&(config.args_)->subtype_ + lVar14),10,
                                  (int *)&chunk);
            if (0xffff < uVar10) goto LAB_00103946;
            if ((uint32_t)chunk.bytes != 0) goto LAB_00103b9d;
            uStack_5c = uVar10;
          }
          else {
            if (iVar2 != 3) {
              pcVar16 = "ERROR: Invalid subtype for \'frame\'";
              uStack_140 = 0x22;
              goto LAB_00103b94;
            }
            iVar2 = ParseBgcolorArgs(*(char **)((long)&(config.args_)->subtype_ + lVar14),
                                     (uint32_t *)&chunk);
            if (iVar2 == 0) {
              pcVar16 = "ERROR: Could not parse the background color \n";
              goto LAB_00103a3a;
            }
            parse_error = (uint32_t)chunk.bytes;
          }
LAB_00103599:
          lVar14 = lVar14 + 0x18;
        }
        params = (WebPData *)&parse_error;
LAB_001037bd:
        WVar7 = WebPMuxSetAnimationParams(pWVar13,(WebPMuxAnimParams *)params);
        if (WVar7 == WEBP_MUX_OK) goto LAB_001037d9;
        pcVar16 = kErrorMessages[-WVar7];
        pcVar15 = "ERROR (%s): Could not set animation parameters.\n";
      }
      fprintf(_stderr,pcVar15,pcVar16);
      goto LAB_00103b9d;
    default:
      pcVar16 = "ERROR: Invalid feature for action \'set\'.\n";
LAB_00103b92:
      uStack_140 = 0x29;
      break;
    case FEATURE_LOOP:
      _parse_error = (WebPMuxAnimParams)((ulong)_parse_error & 0xffffffff00000000);
      chunk.bytes = (uint8_t *)0xffffffff;
      uVar10 = ExUtilGetInt((config.args_)->params_,10,&parse_error);
      if ((uVar10 < 0x10000) && (parse_error == 0)) {
        iVar2 = CreateMux(config.input_,&mux);
        pWVar13 = mux;
        if (iVar2 == 0) goto LAB_00103b9d;
        WVar7 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&chunk);
        if (WVar7 == WEBP_MUX_OK) {
          params = &chunk;
          chunk.bytes = (uint8_t *)CONCAT44(uVar10,(uint32_t)chunk.bytes);
          goto LAB_001037bd;
        }
LAB_0010395e:
        pcVar16 = "ERROR: input file does not seem to be an animation.\n";
        uStack_140 = 0x34;
      }
      else {
LAB_00103946:
        pcVar16 = "ERROR: Loop count must be in the range 0 to 65535.\n";
        uStack_140 = 0x33;
      }
      break;
    case FEATURE_BGCOLOR:
      chunk.bytes = (uint8_t *)0xffffffff;
      iVar2 = ParseBgcolorArgs((config.args_)->params_,(uint32_t *)&parse_error);
      if (iVar2 != 0) {
        iVar2 = CreateMux(config.input_,&mux);
        pWVar13 = mux;
        if (iVar2 == 0) goto LAB_00103b9d;
        WVar7 = WebPMuxGetAnimationParams(mux,(WebPMuxAnimParams *)&chunk);
        if (WVar7 != WEBP_MUX_OK) goto LAB_0010395e;
        params = &chunk;
        chunk.bytes = (uint8_t *)CONCAT44(chunk.bytes._4_4_,parse_error);
        goto LAB_001037bd;
      }
      pcVar16 = "ERROR: Could not parse the background color.\n";
LAB_00103a3a:
      uStack_140 = 0x2d;
    }
LAB_00103b94:
    fwrite(pcVar16,uStack_140,1,_stderr);
LAB_00103b9d:
    uVar10 = 0;
    break;
  case ACTION_STRIP:
    iVar2 = CreateMux(config.input_,&mux);
    pWVar13 = mux;
    uVar10 = 0;
    if (iVar2 != 0) {
      if (config.type_ - FEATURE_EXIF < 3) {
        WVar7 = WebPMuxDeleteChunk(mux,kFourccList[config.type_]);
        if (WVar7 == WEBP_MUX_OK) goto LAB_001037d9;
        pcVar16 = kErrorMessages[-WVar7];
        pcVar15 = kDescriptions[config.type_];
        __format = "ERROR (%s): Could not strip the %s.\n";
LAB_001038fc:
        uVar10 = 0;
        fprintf(_stderr,__format,pcVar16,pcVar15);
      }
      else {
        pcVar16 = "ERROR: Invalid feature for action \'strip\'.\n";
        uStack_140 = 0x2b;
LAB_00103a54:
        uVar10 = 0;
        fwrite(pcVar16,uStack_140,1,_stderr);
      }
    }
    break;
  case ACTION_INFO:
    iVar2 = CreateMux(config.input_,&mux);
    pWVar13 = mux;
    if (iVar2 == 0) goto LAB_00103b9d;
    WebPMuxGetCanvasSize(mux,&unused,(int *)&plus_minus);
    printf("Canvas size: %d x %d\n",(ulong)(uint)unused,(ulong)_plus_minus);
    local_130 = pWVar13;
    WVar7 = WebPMuxGetFeatures(pWVar13,&flag);
    if (WVar7 != WEBP_MUX_OK) {
      pcVar16 = "Failed to retrieve features\n";
      uStack_140 = 0x1c;
      goto LAB_00103b94;
    }
    if (flag == 0) {
      puts("No features present.");
    }
    else {
      printf("Features present:");
      if ((flag & 2) != 0) {
        printf(" animation");
      }
      if ((flag & 0x20) != 0) {
        printf(" ICC profile");
      }
      if ((flag & 8) != 0) {
        printf(" EXIF metadata");
      }
      if ((flag & 4) != 0) {
        printf(" XMP metadata");
      }
      if ((flag & 0x10) != 0) {
        printf(" transparency");
      }
      putchar(10);
      pWVar13 = local_130;
      if ((flag & 2) != 0) {
        WebPMuxGetAnimationParams(local_130,(WebPMuxAnimParams *)&dispose_method);
        printf("Background color : 0x%.8X  Loop Count : %d\n",(ulong)(uint)dispose_method,
               (ulong)local_114);
        WebPMuxNumChunks(pWVar13,WEBP_CHUNK_ANMF,&nFrames);
        printf("Number of %ss: %d\n","frame",(ulong)(uint)nFrames);
        if (0 < nFrames) {
          printf("No.: width height alpha x_offset y_offset ");
          printf("duration   dispose blend ");
          puts("image_size  compression");
          for (nth = 1; (int)nth <= nFrames; nth = nth + 1) {
            WVar7 = WebPMuxGetFrame(local_130,nth,(WebPMuxFrameInfo *)&chunk);
            if (WVar7 != WEBP_MUX_OK) {
              WebPDataClear(&chunk);
              uVar10 = 0;
              fprintf(_stderr,"Failed to retrieve %s#%d\n","frame",(ulong)nth);
              goto switchD_00102bb9_caseD_5;
            }
            WebPGetFeaturesInternal
                      (chunk.bytes,chunk.size,(WebPBitstreamFeatures *)&parse_error,0x209);
            pcVar16 = "yes";
            if (local_58 == 0) {
              pcVar16 = "no";
            }
            printf("%3d: %5d %5d %5s %8d %8d ",(ulong)nth,(ulong)_parse_error & 0xffffffff,
                   (ulong)_parse_error >> 0x20,pcVar16,local_f8 & 0xffffffff,local_f8 >> 0x20);
            pcVar16 = "background";
            if (local_e8 == WEBP_MUX_DISPOSE_NONE) {
              pcVar16 = "none";
            }
            pcVar15 = "no";
            if (local_e4 == WEBP_MUX_BLEND) {
              pcVar15 = "yes";
            }
            printf("%8d %10s %5s ",(ulong)local_f0,pcVar16,pcVar15);
            pcVar16 = "undefined";
            if (local_50 == 2) {
              pcVar16 = "lossless";
            }
            if (local_50 == 1) {
              pcVar16 = "lossy";
            }
            printf("%10d %11s\n",chunk.size & 0xffffffff,pcVar16);
            WebPDataClear(&chunk);
          }
        }
      }
      if ((flag & 0x20) != 0) {
        WebPMuxGetChunk(local_130,"ICCP",&chunk);
        printf("Size of the ICC profile data: %d\n",chunk.size & 0xffffffff);
      }
      if ((flag & 8) != 0) {
        WebPMuxGetChunk(local_130,"EXIF",&chunk);
        printf("Size of the EXIF metadata: %d\n",chunk.size & 0xffffffff);
      }
      if ((flag & 4) != 0) {
        WebPMuxGetChunk(local_130,"XMP ",&chunk);
        printf("Size of the XMP metadata: %d\n",chunk.size & 0xffffffff);
      }
      if ((flag & 0x12) == 0x10) {
        uVar10 = 1;
        WVar7 = WebPMuxGetFrame(local_130,1,(WebPMuxFrameInfo *)&chunk);
        if (WVar7 == WEBP_MUX_OK) {
          printf("Size of the image (with alpha): %d\n",chunk.size & 0xffffffff);
          WebPDataClear(&chunk);
          break;
        }
        WebPDataClear(&chunk);
        pcVar16 = "Failed to retrieve the image\n";
        uStack_140 = 0x1d;
        goto LAB_00103b94;
      }
    }
    uVar10 = 1;
    break;
  case ACTION_DURATION:
    iVar2 = CreateMux(config.input_,&mux);
    pWVar13 = mux;
    uVar10 = 0;
    if (iVar2 != 0) {
      WVar7 = WebPMuxNumChunks(mux,WEBP_CHUNK_ANMF,&dispose_method);
      if (WVar7 != WEBP_MUX_OK) {
        pcVar16 = "ERROR: can not parse the number of frames.\n";
        uStack_140 = 0x2b;
        goto LAB_00103b94;
      }
      if (dispose_method == 0) {
        fwrite("Doesn\'t look like the source is animated. Skipping duration setting.\n",0x45,1,
               _stderr);
        goto LAB_001037d9;
      }
      uVar10 = (uint)(WVar7 == WEBP_MUX_OK);
      pWVar11 = WebPMuxNew();
      if (pWVar11 != (WebPMux *)0x0) {
        WVar7 = WebPMuxGetAnimationParams(pWVar13,(WebPMuxAnimParams *)&parse_error);
        if ((WVar7 == WEBP_MUX_OK) &&
           (WVar7 = WebPMuxSetAnimationParams(pWVar11,(WebPMuxAnimParams *)&parse_error),
           WVar7 != WEBP_MUX_OK)) {
          fprintf(_stderr,"Error (%s) handling animation params.\n",kErrorMessages[-WVar7]);
LAB_001039f8:
          WebPMuxDelete(pWVar11);
        }
        else {
          local_130 = (WebPMux *)CONCAT44(local_130._4_4_,uVar10);
          for (lVar14 = 1; lVar14 != 4; lVar14 = lVar14 + 1) {
            pcVar16 = kFourccList[lVar14];
            WVar7 = WebPMuxGetChunk(pWVar13,pcVar16,&chunk);
            if (((WVar7 == WEBP_MUX_OK) && (chunk.size != 0)) &&
               (WVar7 = WebPMuxSetChunk(pWVar11,pcVar16,&chunk,1), WVar7 != WEBP_MUX_OK)) {
              fwrite("Error transferring metadata in DuplicateMux().",0x2e,1,_stderr);
              uVar10 = (uint)local_130;
              goto LAB_001039f8;
            }
          }
          ptr = WebPMalloc((long)dispose_method << 2);
          uVar10 = (uint)local_130;
          if (ptr != (void *)0x0) {
            for (lVar14 = 0; lVar14 < dispose_method; lVar14 = lVar14 + 1) {
              *(undefined4 *)((long)ptr + lVar14 * 4) = 0xffffffff;
            }
            for (lVar14 = 0; pWVar19 = pWVar11, lVar14 < config.arg_count_; lVar14 = lVar14 + 1) {
              uVar10 = ExUtilGetInts(config.args_[lVar14].params_,10,3,(int *)&chunk);
              if ((int)uVar10 < 1) {
LAB_00103b0a:
                uVar10 = 0;
                goto LAB_00103b0c;
              }
              if ((int)(uint32_t)chunk.bytes < 0) {
                fwrite("ERROR: duration must be strictly positive.\n",0x2b,1,_stderr);
                goto LAB_00103b0a;
              }
              iVar2 = dispose_method;
              if (uVar10 == 1) {
                lVar12 = 1;
              }
              else {
                iVar3 = dispose_method;
                if (chunk.bytes._4_4_ < dispose_method) {
                  iVar3 = chunk.bytes._4_4_;
                }
                if (chunk.bytes._4_4_ < 1) {
                  iVar3 = 1;
                }
                iVar4 = iVar3;
                if (2 < uVar10) {
                  iVar4 = (int)chunk.size;
                }
                if (iVar4 < dispose_method) {
                  iVar2 = iVar4;
                }
                if (iVar4 == 0) {
                  iVar2 = dispose_method;
                }
                lVar12 = (long)iVar3;
              }
              for (; lVar12 <= iVar2; lVar12 = lVar12 + 1) {
                *(uint32_t *)((long)ptr + lVar12 * 4 + -4) = (uint32_t)chunk.bytes;
              }
            }
            for (uVar18 = 1; (long)uVar18 <= (long)dispose_method; uVar18 = uVar18 + 1) {
              WVar7 = WebPMuxGetFrame(pWVar13,(uint32_t)uVar18,(WebPMuxFrameInfo *)&chunk);
              if ((WVar7 != WEBP_MUX_OK) || (local_ec != WEBP_CHUNK_ANMF)) {
                pcVar16 = "ERROR: can not retrieve frame #%d.\n";
LAB_00103b31:
                uVar10 = 0;
                fprintf(_stderr,pcVar16,uVar18 & 0xffffffff);
                goto LAB_00103b0c;
              }
              uVar10 = *(uint *)((long)ptr + uVar18 * 4 + -4);
              if (-1 < (int)uVar10) {
                local_f0 = uVar10;
              }
              WVar7 = WebPMuxPushFrame(pWVar11,(WebPMuxFrameInfo *)&chunk,1);
              if (WVar7 != WEBP_MUX_OK) {
                pcVar16 = "ERROR: error push frame data #%d\n";
                goto LAB_00103b31;
              }
              WebPDataClear(&chunk);
            }
            WebPMuxDelete(pWVar13);
            uVar10 = WriteWebP(pWVar11,config.output_);
            pWVar19 = (WebPMux *)0x0;
            mux = pWVar11;
LAB_00103b0c:
            WebPFree(ptr);
            WebPMuxDelete(pWVar19);
          }
        }
      }
    }
  }
switchD_00102bb9_caseD_5:
  WebPMuxDelete(mux);
  uVar10 = (uint)(uVar10 == 0);
LAB_00103bb3:
  DeleteConfig(&config);
  return uVar10;
}

Assistant:

int main(int argc, const char* argv[]) {
  Config config;
  int ok;

  INIT_WARGV(argc, argv);

  ok = InitializeConfig(argc - 1, argv + 1, &config, GET_WARGV_OR_NULL());
  if (ok) {
    ok = Process(&config);
  } else {
    PrintHelp();
  }
  DeleteConfig(&config);
  FREE_WARGV_AND_RETURN(!ok);
}